

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

string * google::protobuf::CEscape(string *__return_storage_ptr__,string *src)

{
  protobuf *this;
  char *size;
  string *in_RCX;
  StringPiece src_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this = (protobuf *)(src->_M_dataplus)._M_p;
  size = (char *)src->_M_string_length;
  if ((long)size < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
  }
  src_00.length_ = (stringpiece_ssize_type)__return_storage_ptr__;
  src_00.ptr_ = size;
  CEscapeAndAppend(this,src_00,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

string CEscape(const string& src) {
  string dest;
  CEscapeAndAppend(src, &dest);
  return dest;
}